

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O1

void __thiscall ExecutionEngine::i_lconst_0(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  anon_union_8_10_52016fac_for_data extraout_RDX;
  Value operand;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand.data.longValue = extraout_RDX.longValue;
  operand.printType = BOOLEAN;
  operand.type = PADDING;
  Frame::pushIntoOperandStack(this_01,operand);
  Frame::pushIntoOperandStack(this_01,(Value)ZEXT816(0x600000000));
  this_01->pc = this_01->pc + 1;
  return;
}

Assistant:

void ExecutionEngine::i_lconst_0() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value padding;
    padding.type = ValueType::PADDING;

    Value value;
    value.type = ValueType::LONG;
    value.data.longValue = 0;

    topFrame->pushIntoOperandStack(padding);
    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 1;
}